

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::IntegerFunctionCase::~IntegerFunctionCase(IntegerFunctionCase *this)

{
  IntegerFunctionCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IntegerFunctionCase_01672fa8;
  ShaderSpec::~ShaderSpec(&this->m_spec);
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

IntegerFunctionCase::~IntegerFunctionCase (void)
{
}